

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O0

bool __thiscall
crnlib::static_huffman_data_model::prepare_decoder_tables(static_huffman_data_model *this)

{
  bool bVar1;
  uint uVar2;
  uint table_bits;
  decoder_tables *pdVar3;
  uchar *pCodesizes;
  uint total_syms;
  static_huffman_data_model *this_local;
  
  uVar2 = vector<unsigned_char>::size(&this->m_code_sizes);
  this->m_encoding = false;
  this->m_total_syms = uVar2;
  vector<unsigned_short>::clear(&this->m_codes);
  if (this->m_pDecode_tables == (decoder_tables *)0x0) {
    pdVar3 = crnlib_new<crnlib::prefix_coding::decoder_tables>();
    this->m_pDecode_tables = pdVar3;
  }
  uVar2 = this->m_total_syms;
  pCodesizes = vector<unsigned_char>::operator[](&this->m_code_sizes,0);
  pdVar3 = this->m_pDecode_tables;
  table_bits = compute_decoder_table_bits(this);
  bVar1 = prefix_coding::generate_decoder_tables(uVar2,pCodesizes,pdVar3,table_bits);
  return bVar1;
}

Assistant:

bool static_huffman_data_model::prepare_decoder_tables()
    {
        uint total_syms = m_code_sizes.size();

        CRNLIB_ASSERT((total_syms >= 1) && (total_syms <= prefix_coding::cMaxSupportedSyms));

        m_encoding = false;

        m_total_syms = total_syms;

        m_codes.clear();

        if (!m_pDecode_tables)
        {
            m_pDecode_tables = crnlib_new<prefix_coding::decoder_tables>();
        }

        return prefix_coding::generate_decoder_tables(m_total_syms, &m_code_sizes[0], m_pDecode_tables, compute_decoder_table_bits());
    }